

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_io.c
# Opt level: O2

int unix_read_func(void *conn,void *buffer,size_t length,int *errno_p,char **result_p)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  sVar3 = read((int)conn,buffer,length);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    iVar5 = *piVar4;
    if (errno_p != (int *)0x0) {
      *errno_p = iVar5;
    }
    if ((iVar5 == 0xb) || (iVar5 == 4)) {
      if (errno_p != (int *)0x0) {
        *errno_p = 0;
      }
      iVar2 = 0;
    }
    else {
      iVar2 = -1;
    }
    if ((iVar5 != 0xb) && (iVar5 != 4)) {
      return -1;
    }
  }
  else if (iVar2 == 0) {
    if (result_p != (char **)0x0) {
      *result_p = "End of file";
    }
    if (errno_p == (int *)0x0) {
      return 0;
    }
    *errno_p = 0;
    return 0;
  }
  iVar5 = -1;
  iVar6 = (int)length;
  uVar7 = iVar6 - iVar2;
  do {
    if ((int)uVar7 < 1) {
LAB_00121d46:
      return (int)length;
    }
    sVar3 = read((int)conn,(void *)((long)buffer + (length - uVar7)),(ulong)uVar7);
    iVar2 = (int)sVar3;
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      if (errno_p != (int *)0x0) {
        *errno_p = iVar1;
      }
      if ((iVar1 == 4) || (iVar1 == 0xb)) {
        iVar2 = 0;
        if (errno_p != (int *)0x0) {
          *errno_p = 0;
        }
      }
      else {
        iVar5 = iVar6 - uVar7;
        iVar2 = -1;
      }
      if ((iVar1 != 0xb) && (iVar1 != 4)) {
        return iVar5;
      }
    }
    else if (iVar2 == 0) {
      if (result_p != (char **)0x0) {
        *result_p = "End of file";
      }
      if (errno_p != (int *)0x0) {
        *errno_p = 0;
      }
      length = (size_t)(iVar6 - uVar7);
      goto LAB_00121d46;
    }
    uVar7 = uVar7 - iVar2;
  } while( true );
}

Assistant:

static int
unix_read_func(void *conn, void *buffer, size_t length, int *errno_p, char **result_p)
{
    int left = length;
    int iget;
    int fd = (int) (long) conn;

    iget = read(fd, (char *) buffer, length);
    if (iget == 0) {
	if (result_p) *result_p = "End of file";
	if (errno_p) *errno_p = 0;
	return 0;		/* end of file */
    } else if (iget == -1) {
	int lerrno = errno;
	if (errno_p) *errno_p = lerrno;
	if ((lerrno != EWOULDBLOCK) &&
	    (lerrno != EAGAIN) &&
	    (lerrno != EINTR)) {
	    /* serious error */
	    return -1;
	} else {
	    if (errno_p) *errno_p = 0;
	    iget = 0;
	}
    }
    left = length - iget;
    while (left > 0) {
	iget = read(fd, (char *) buffer + length - left, left);
	if (iget == 0) {
	    if (result_p) *result_p = "End of file";
	    if (errno_p) *errno_p = 0;
	    return length - left;	/* end of file */
	} else if (iget == -1) {
	    int lerrno = errno;
	    if (errno_p) *errno_p = errno;
	    if ((lerrno != EWOULDBLOCK) &&
		(lerrno != EAGAIN) &&
		(lerrno != EINTR)) {
		/* serious error */
		return (length - left);
	    } else {
		if (errno_p) *errno_p = 0;
		iget = 0;
	    }
	}
	left -= iget;
    }
    return length;
}